

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlkem_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_392279::MLKEMTest_Iterate1024_Test::TestBody(MLKEMTest_Iterate1024_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_c8 [3];
  Message local_b0;
  Span<const_unsigned_char> local_a8;
  Bytes local_98;
  Span<const_unsigned_char> local_88;
  Bytes local_78;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  uint8_t kExpected [32];
  uint8_t result [32];
  MLKEMTest_Iterate1024_Test *this_local;
  
  IteratedTest<MLKEM1024_public_key,_1568UL,_MLKEM1024_private_key,_3168UL,_&(anonymous_namespace)::wrapper_1024_generate_key_external_seed,_&MLKEM1024_public_from_private,_&(anonymous_namespace)::wrapper_1024_marshal_private_key,_1568UL,_&(anonymous_namespace)::wrapper_1024_encap_external_entropy,_&MLKEM1024_decap>
            (kExpected + 0x18);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x2e7b3013b082bfe3;
  kExpected[0] = 0x9d;
  kExpected[1] = 'G';
  kExpected[2] = 0xdd;
  kExpected[3] = 0xe7;
  kExpected[4] = 0x91;
  kExpected[5] = 0xff;
  kExpected[6] = 'm';
  kExpected[7] = 0xfc;
  kExpected[8] = 0x82;
  kExpected[9] = 0xe6;
  kExpected[10] = 0x94;
  kExpected[0xb] = 0xe6;
  kExpected[0xc] = '8';
  kExpected[0xd] = '$';
  kExpected[0xe] = '\x04';
  kExpected[0xf] = 0xab;
  kExpected[0x10] = 0xdb;
  kExpected[0x11] = 0x94;
  kExpected[0x12] = 0x8b;
  kExpected[0x13] = 0x90;
  kExpected[0x14] = 0x8b;
  kExpected[0x15] = 'u';
  kExpected[0x16] = 0xba;
  kExpected[0x17] = 0xd5;
  bssl::Span<unsigned_char_const>::Span<32ul>
            ((Span<unsigned_char_const> *)&local_88,(uchar (*) [32])(kExpected + 0x18));
  Bytes::Bytes(&local_78,local_88);
  bssl::Span<unsigned_char_const>::Span<32ul>
            ((Span<unsigned_char_const> *)&local_a8,(uchar (*) [32])&gtest_ar.message_);
  Bytes::Bytes(&local_98,local_a8);
  testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
            ((EqHelper *)local_68,"Bytes(result)","Bytes(kExpected)",&local_78,&local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mlkem/mlkem_test.cc"
               ,0x210,message);
    testing::internal::AssertHelper::operator=(local_c8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(local_c8);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  return;
}

Assistant:

TEST(MLKEMTest, Iterate1024) {
  // The structure of this test is taken from
  // https://github.com/C2SP/CCTV/blob/main/ML-KEM/README.md?ref=words.filippo.io#accumulated-pq-crystals-vectors
  // but the final value has been updated to reflect the change from Kyber to
  // ML-KEM.
  uint8_t result[32];
  IteratedTest<MLKEM1024_public_key, MLKEM1024_PUBLIC_KEY_BYTES,
               MLKEM1024_private_key, BCM_MLKEM1024_PRIVATE_KEY_BYTES,
               wrapper_1024_generate_key_external_seed,
               MLKEM1024_public_from_private, wrapper_1024_marshal_private_key,
               MLKEM1024_CIPHERTEXT_BYTES, wrapper_1024_encap_external_entropy,
               MLKEM1024_decap>(result);

  const uint8_t kExpected[32] = {
      0xe3, 0xbf, 0x82, 0xb0, 0x13, 0x30, 0x7b, 0x2e, 0x9d, 0x47, 0xdd,
      0xe7, 0x91, 0xff, 0x6d, 0xfc, 0x82, 0xe6, 0x94, 0xe6, 0x38, 0x24,
      0x04, 0xab, 0xdb, 0x94, 0x8b, 0x90, 0x8b, 0x75, 0xba, 0xd5};
  EXPECT_EQ(Bytes(result), Bytes(kExpected));
}